

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O1

GameResult * __thiscall Game::play(Game *this)

{
  State *s;
  char cVar1;
  bool bVar2;
  pointer pGVar3;
  bool bVar4;
  pointer piVar5;
  int iVar6;
  int iVar7;
  Ghost_State *ghost;
  ostream *poVar8;
  int extraout_var;
  int *piVar9;
  int extraout_var_00;
  size_t sVar10;
  pointer pGVar11;
  int iVar12;
  ulong uVar13;
  pointer ppAVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  byte bVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  float fVar22;
  vector<int,_std::allocator<int>_> ghosts_pos;
  vector<Position,_std::allocator<Position>_> ghost_previous_pos;
  char str [200];
  vector<int,_std::allocator<int>_> local_158;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_138;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_130;
  long local_128;
  long local_120;
  Position local_118;
  vector<Position,_std::allocator<Position>_> local_110;
  int local_f8 [2];
  undefined1 uStack_f0;
  undefined4 uStack_ef;
  undefined2 uStack_eb;
  undefined1 uStack_e9;
  undefined1 uStack_e8;
  undefined4 uStack_e7;
  undefined2 uStack_e3;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined4 uStack_df;
  undefined2 uStack_db;
  undefined1 uStack_d9;
  undefined2 local_d8;
  
  if (this->loaded_maze == false) {
    uStack_e8 = 0x6f;
    uStack_e7 = 0x61207475;
    uStack_e3 = 0x6c20;
    uStack_e1 = 0x6f;
    uStack_e0 = 0x61;
    uStack_df = 0x20646564;
    uStack_db = 0x616d;
    uStack_d9 = 0x7a;
    local_f8 = (int  [2])0x70206f7420797254;
    uStack_f0 = 0x6c;
    uStack_ef = 0x77207961;
    uStack_eb = 0x7469;
    uStack_e9 = 0x68;
    local_d8 = 0x65;
    poVar8 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar8 = std::operator<<(poVar8,"][");
    poVar8 = std::operator<<(poVar8,"play");
    poVar8 = std::operator<<(poVar8,"][Line ");
    iVar7 = 0xab;
  }
  else {
    if (this->pacman != (Agent *)0x0) {
      if (Arguments::plays == 1) {
        poVar8 = operator<<((ostream *)&std::cout,&this->state);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      s = &this->state;
      local_138 = &(this->state).pills._M_h;
      local_130 = &(this->state).powerpills._M_h;
      do {
        iVar7 = (this->state).n_normal_pills_left;
        piVar9 = &(this->state).n_powerpills_left;
        iVar6 = iVar7 + *piVar9;
        if (iVar6 == 0 || SCARRY4(iVar7,*piVar9) != iVar6 < 0) break;
        if (Arguments::plays == 1) {
          std::ostream::flush();
          usleep((__useconds_t)(long)Arguments::visualization_speed);
        }
        update_ghost_states(this);
        piVar9 = &(this->state).round;
        *piVar9 = *piVar9 + 1;
        iVar7 = (this->state).n_rounds_powerpill;
        if (iVar7 < 2) {
          iVar7 = 1;
        }
        (this->state).n_rounds_powerpill = iVar7 + -1;
        iVar7 = (**this->pacman->_vptr_Agent)(this->pacman,s,0);
        local_118 = (this->state).pacman.pos;
        std::vector<Position,_std::allocator<Position>_>::vector
                  (&local_110,(long)State::n_ghosts,(allocator_type *)local_f8);
        if (0 < State::n_ghosts) {
          piVar9 = &(((this->state).ghosts.
                      super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_Agent_State).pos.j;
          lVar15 = 0;
          do {
            local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15].i = ((Position *)(piVar9 + -1))->i;
            local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15].j = *piVar9;
            lVar15 = lVar15 + 1;
            piVar9 = piVar9 + 0x11;
          } while (lVar15 < State::n_ghosts);
        }
        if (((this->state).pacman.dir.i == iVar7) && ((this->state).pacman.dir.j == extraout_var)) {
          fVar22 = Arguments::pacman_speed + (this->state).pacman.step;
          (this->state).pacman.step = fVar22;
          if (fVar22 < 1.0) goto LAB_0010b3f7;
          (this->state).pacman.step = fVar22 + -1.0;
          lVar20 = (long)iVar7 + (long)(this->state).pacman.pos.i;
          lVar16 = (long)extraout_var + (long)(this->state).pacman.pos.j;
          lVar15 = lVar20 * 3;
          cVar1 = *(char *)(*(long *)&(this->state).maze.t.
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data + lVar16);
          if (cVar1 == '%') {
            uStack_e8 = 0x69;
            uStack_e7 = 0x77206874;
            uStack_e3 = 0x6c61;
            uStack_e1 = 0x6c;
            uStack_e0 = 0;
            local_f8 = (int  [2])0x63206e616d636150;
            uStack_f0 = 0x72;
            uStack_ef = 0x65687361;
            uStack_eb = 0x2073;
            uStack_e9 = 0x77;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Debug[",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                       ,0x5a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xcf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
            sVar10 = strlen((char *)local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_f8,sVar10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            goto LAB_0010b3f7;
          }
          local_128 = lVar15;
          if (cVar1 == 'X') {
            uStack_e8 = 0x69;
            uStack_e7 = 0x73206874;
            uStack_e3 = 0x6170;
            uStack_e1 = 0x77;
            uStack_e0 = 0x6e;
            uStack_df = 0x65726120;
            uStack_db = 0x61;
            local_f8 = (int  [2])0x63206e616d636150;
            uStack_f0 = 0x72;
            uStack_ef = 0x65687361;
            uStack_eb = 0x2073;
            uStack_e9 = 0x77;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Debug[",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                       ,0x5a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
            sVar10 = strlen((char *)local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_f8,sVar10);
            std::endl<char,std::char_traits<char>>(poVar8);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                          ,0xd3,"GameResult &Game::play()");
          }
          (this->state).pacman.pos.i = (int)lVar20;
          (this->state).pacman.pos.j = (int)lVar16;
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (int *)0x0;
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          pGVar11 = (this->state).ghosts.
                    super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->state).ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
              _M_impl.super__Vector_impl_data._M_finish != pGVar11) {
            uVar19 = 0;
            do {
              iVar7 = (int)uVar19;
              if ((pGVar11[uVar19].super_Agent_State.pos.i == (int)lVar20) &&
                 (pGVar11[uVar19].super_Agent_State.pos.j == (int)lVar16)) {
                local_f8[0] = iVar7;
                if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&local_158,
                             (iterator)
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,local_f8);
                }
                else {
                  *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar7;
                  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              uVar19 = (ulong)(iVar7 + 1);
              pGVar11 = (this->state).ghosts.
                        super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar13 = ((long)(this->state).ghosts.
                              super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pGVar11 >> 2) *
                       -0xf0f0f0f0f0f0f0f;
            } while (uVar19 <= uVar13 && uVar13 - uVar19 != 0);
          }
          piVar5 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar9 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_120 = lVar16;
          if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar18 = 1;
          }
          else {
            do {
              piVar21 = piVar9 + 1;
              if ((this->state).n_rounds_powerpill < 1) {
LAB_0010b392:
                this->game_over = true;
              }
              else {
                iVar7 = *piVar9;
                pGVar11 = (this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((pGVar11[iVar7].maybe_scared & 1U) == 0) goto LAB_0010b392;
                (*this->pacman->_vptr_Agent[4])();
                pGVar11 = pGVar11 + iVar7;
                pGVar11->maybe_scared = false;
                pGVar11->n_rounds_revive = Arguments::n_rounds_ghost_revive;
                (pGVar11->super_Agent_State).pos.i = -1;
                (pGVar11->super_Agent_State).pos.j = -1;
              }
            } while ((this->game_over == false) && (piVar9 = piVar21, piVar21 != piVar5));
            bVar18 = this->game_over ^ 1;
          }
          lVar15 = local_120;
          if ((bVar18 != 0) && (cVar1 != ' ')) {
            if (cVar1 == 'o') {
              *(undefined1 *)
               (*(long *)&(this->state).maze.t.
                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar20].
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + local_120) = 0x20;
              piVar9 = &(this->state).n_powerpills_left;
              *piVar9 = *piVar9 + -1;
              local_f8[0] = PathMagic::index_from_pos.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_120];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_138,local_f8);
              local_f8[0] = (&((PathMagic::index_from_pos.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start)[local_128][lVar15];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_130,local_f8);
              (*this->pacman->_vptr_Agent[3])();
              pGVar3 = (this->state).ghosts.
                       super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pGVar11 = (this->state).ghosts.
                             super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                             super__Vector_impl_data._M_start; pGVar11 != pGVar3;
                  pGVar11 = pGVar11 + 1) {
                pGVar11->maybe_scared = true;
              }
              (this->state).n_rounds_powerpill = Arguments::n_rounds_powerpill;
            }
            else {
              if (cVar1 != '.') {
                sprintf((char *)local_f8,"Invalid cell_content character \'%c\'",
                        (ulong)(uint)(int)cVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error[",6)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                           ,0x5a);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"][Line ",7);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                sVar10 = strlen((char *)local_f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_f8,sVar10);
                std::endl<char,std::char_traits<char>>(poVar8);
                goto LAB_0010bd29;
              }
              *(undefined1 *)
               (*(long *)&(this->state).maze.t.
                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar20].
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + local_120) = 0x20;
              piVar9 = &(this->state).n_normal_pills_left;
              *piVar9 = *piVar9 + -1;
              local_f8[0] = PathMagic::index_from_pos.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_120];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_138,local_f8);
              (*this->pacman->_vptr_Agent[2])();
            }
          }
          if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (bVar18 != 0) goto LAB_0010b3f7;
LAB_0010b9f9:
          bVar2 = false;
        }
        else {
          (*this->pacman->_vptr_Agent[5])();
          (this->state).pacman.step = (1.0 - (this->state).pacman.step) * Arguments::pacman_speed;
          (this->state).pacman.dir.i = iVar7;
          (this->state).pacman.dir.j = extraout_var;
LAB_0010b3f7:
          iVar7 = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
          ppAVar14 = (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          iVar6 = (int)((ulong)((long)(this->ghosts).
                                      super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)ppAVar14) >> 3);
          if (iVar6 <= iVar7) {
            iVar7 = iVar6;
          }
          bVar2 = 0 < iVar7;
          if (0 < iVar7) {
            lVar15 = 0;
            uVar19 = 0;
            do {
              pGVar11 = (this->state).ghosts.
                        super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar7 = *(int *)((long)&pGVar11->n_rounds_revive + lVar15);
              if (iVar7 == 1) {
                *(undefined8 *)((long)&(pGVar11->super_Agent_State).pos.i + lVar15) =
                     *(undefined8 *)((long)&(pGVar11->initial_pos).i + lVar15);
                iVar7 = 0;
LAB_0010b495:
                *(int *)((long)&pGVar11->n_rounds_revive + lVar15) = iVar7;
              }
              else {
                if (iVar7 != 0) {
                  iVar7 = iVar7 + -1;
                  goto LAB_0010b495;
                }
                iVar7 = (**ppAVar14[uVar19]->_vptr_Agent)(ppAVar14[uVar19],s,uVar19 & 0xffffffff);
                if ((*(int *)((long)&(pGVar11->super_Agent_State).dir.i + lVar15) == iVar7) &&
                   (*(int *)((long)&(pGVar11->super_Agent_State).dir.j + lVar15) == extraout_var_00)
                   ) {
                  fVar22 = Arguments::ghost_speed;
                  if (((&((this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start)->maybe_scared)[lVar15] & 1U) != 0) {
                    fVar22 = Arguments::ghost_afraid_speed_fraction * Arguments::ghost_speed;
                  }
                  iVar6 = (this->state).n_rounds_powerpill;
                  if (iVar6 < 1) {
                    fVar22 = Arguments::ghost_speed;
                  }
                  fVar22 = fVar22 + *(float *)((long)&(pGVar11->super_Agent_State).step + lVar15);
                  *(float *)((long)&(pGVar11->super_Agent_State).step + lVar15) = fVar22;
                  if (fVar22 < 1.0) goto LAB_0010b6e9;
                  *(float *)((long)&(pGVar11->super_Agent_State).step + lVar15) = fVar22 + -1.0;
                  lVar16 = (long)iVar7 +
                           (long)*(int *)((long)&(pGVar11->super_Agent_State).pos.i + lVar15);
                  lVar20 = (long)extraout_var_00 +
                           (long)*(int *)((long)&(pGVar11->super_Agent_State).pos.j + lVar15);
                  if (*(char *)(*(long *)&(this->state).maze.t.
                                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data + lVar20) == '%') {
                    sprintf((char *)local_f8,"Ghost #%d at [%d,%d] crashes with wall",
                            uVar19 & 0xffffffff,
                            (ulong)*(uint *)((long)&(pGVar11->super_Agent_State).pos.i + lVar15),
                            (ulong)*(uint *)((long)&(pGVar11->super_Agent_State).pos.j + lVar15));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Debug[",6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                               ,0x5a);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"play",4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"][Line ",7);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                    sVar10 = strlen((char *)local_f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,(char *)local_f8,sVar10);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
LAB_0010b6e1:
                    iVar7 = 0;
                    bVar4 = true;
                  }
                  else {
                    iVar7 = (int)lVar16;
                    *(int *)((long)&(pGVar11->super_Agent_State).pos.i + lVar15) = iVar7;
                    iVar12 = (int)lVar20;
                    *(int *)((long)&(pGVar11->super_Agent_State).pos.j + lVar15) = iVar12;
                    if (((this->state).pacman.pos.i != iVar7) ||
                       ((this->state).pacman.pos.j != iVar12)) goto LAB_0010b6e1;
                    if ((iVar6 < 1) || (((&pGVar11->maybe_scared)[lVar15] & 1U) == 0)) {
                      this->game_over = true;
                    }
                    else {
                      (*this->pacman->_vptr_Agent[4])();
                      (&pGVar11->maybe_scared)[lVar15] = false;
                      *(int *)((long)&pGVar11->n_rounds_revive + lVar15) =
                           Arguments::n_rounds_ghost_revive;
                      *(undefined8 *)((long)&(pGVar11->super_Agent_State).pos.i + lVar15) =
                           0xffffffffffffffff;
                    }
                    if (this->game_over == false) goto LAB_0010b6e1;
                    iVar7 = 9;
                    bVar4 = false;
                  }
                  if (bVar4) goto LAB_0010b6e9;
                }
                else {
                  fVar22 = Arguments::ghost_speed;
                  if (((&((this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start)->maybe_scared)[lVar15] & 1U) != 0) {
                    fVar22 = Arguments::ghost_afraid_speed_fraction * Arguments::ghost_speed;
                  }
                  if ((this->state).n_rounds_powerpill < 1) {
                    fVar22 = Arguments::ghost_speed;
                  }
                  *(float *)((long)&(pGVar11->super_Agent_State).step + lVar15) =
                       (1.0 - *(float *)((long)&(pGVar11->super_Agent_State).step + lVar15)) *
                       fVar22;
                  *(int *)((long)&(pGVar11->super_Agent_State).dir.i + lVar15) = iVar7;
                  *(int *)((long)&(pGVar11->super_Agent_State).dir.j + lVar15) = extraout_var_00;
LAB_0010b6e9:
                  iVar7 = 0;
                }
                if (iVar7 != 0) {
                  if (bVar2) goto LAB_0010b9f9;
                  break;
                }
              }
              pGVar11 = (this->state).ghosts.
                        super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int *)((long)&(pGVar11->super_Agent_State).prev.i + lVar15) =
                   local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].i;
              *(int *)((long)&(pGVar11->super_Agent_State).prev.j + lVar15) =
                   local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].j;
              uVar19 = uVar19 + 1;
              iVar7 = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
              ppAVar14 = (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              iVar6 = (int)((ulong)((long)(this->ghosts).
                                          super__Vector_base<Agent_*,_std::allocator<Agent_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar14
                                   ) >> 3);
              if (iVar6 <= iVar7) {
                iVar7 = iVar6;
              }
              lVar15 = lVar15 + 0x44;
              bVar2 = (long)uVar19 < (long)iVar7;
            } while ((long)uVar19 < (long)iVar7);
          }
          (this->state).pacman.prev.i = local_118.i;
          (this->state).pacman.prev.j = local_118.j;
          bVar2 = true;
          if (Arguments::plays == 1) {
            poVar8 = operator<<((ostream *)&std::cout,s);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
        }
        if (local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (bVar2);
      if (Arguments::plays == 1) {
        poVar8 = operator<<((ostream *)&std::cout,s);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar17 = "WON";
        if ((ulong)this->game_over != 0) {
          pcVar17 = "LOST";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar17,(ulong)this->game_over + 3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      bVar2 = this->game_over;
      (this->result).won = (bool)(bVar2 ^ 1);
      (this->result).completion =
           1.0 - (double)((this->state).n_powerpills_left + (this->state).n_normal_pills_left) /
                 (double)State::total_pills;
      (*this->pacman->_vptr_Agent[1])(this->pacman,(ulong)(bVar2 == false));
      return &this->result;
    }
    uStack_e8 = 0x6f;
    uStack_e7 = 0x61207475;
    uStack_e3 = 0x206e;
    uStack_e1 = 0x61;
    uStack_e0 = 0x67;
    uStack_df = 0x746e65;
    local_f8 = (int  [2])0x70206f7420797254;
    uStack_f0 = 0x6c;
    uStack_ef = 0x77207961;
    uStack_eb = 0x7469;
    uStack_e9 = 0x68;
    poVar8 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar8 = std::operator<<(poVar8,"][");
    poVar8 = std::operator<<(poVar8,"play");
    poVar8 = std::operator<<(poVar8,"][Line ");
    iVar7 = 0xac;
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar7);
  poVar8 = std::operator<<(poVar8,"] ");
  poVar8 = std::operator<<(poVar8,(char *)local_f8);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010bd29:
  exit(1);
}

Assistant:

GameResult& play() {
        ensure(loaded_maze, "Try to play without a loaded maze");
        ensure(pacman != NULL, "Try to play without an agent");

        if (Arguments::plays == 1) cout << state << endl;

        while (state.n_powerpills_left + state.n_normal_pills_left > 0) { // break if game_over
            if (Arguments::plays == 1) {
                cout.flush();
                usleep(Arguments::visualization_speed);
            }

            update_ghost_states();

            ++state.round;

            state.n_rounds_powerpill = max(0, state.n_rounds_powerpill - 1);

            Direction pacman_direction = pacman->take_action(state, 0);

            Position pacman_previous_pos = state.pacman.pos;
            vector<Position> ghost_previous_pos(state.n_ghosts);
            for (int i = 0; i < state.n_ghosts; ++i) ghost_previous_pos[i] = state.ghosts[i].pos;

            // TODO: Maybe process movements stochastically to guarantee equality?

            if (state.pacman.dir == pacman_direction) {
                state.pacman.step += Arguments::pacman_speed;

                if (state.pacman.step >= 1) {
                    --state.pacman.step;

                    Position next_pos = state.pacman.pos.move_destination(pacman_direction);
                    char cell_content = state.maze[next_pos.i][next_pos.j];


                    if (cell_content == State::WALL) {
                        _debug("Pacman crashes with wall");
                    }
                    else if (cell_content == State::SPAWN_AREA) {
                        _debug("Pacman crashes with spawn area");
                        assert(false);
                    }
                    else {
                        state.pacman.pos.move(pacman_direction);

                        vector<int> ghosts_pos = state.ghosts_in_position(next_pos);

                        for (int ghost_id : ghosts_pos)
                            if (game_over_on_collision(state.ghosts[ghost_id]))
                                goto end;

                        switch(cell_content) {
                            case State::PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_normal_pills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_pill();
                                break;
                            case State::POWER_PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_powerpills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                state.powerpills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_powerpill();

                                for (Ghost_State& ghost : state.ghosts) ghost.maybe_scared = true;

                                state.n_rounds_powerpill = Arguments::n_rounds_powerpill;
                                break;
                            case State::FREE: break;
                            default: ensure(false, "Invalid cell_content character '%c'", cell_content);
                        }
                    }
                }
            }
            else {
                pacman->notify_reverse_direction();
                state.pacman.step = (1 - state.pacman.step)*Arguments::pacman_speed;
                state.pacman.dir = pacman_direction;
            }

            for (int i = 0; i < min(1 + state.round/Arguments::n_rounds_between_ghosts_start, (int) ghosts.size()); ++i) {
                Ghost_State& ghost = state.ghosts[i];

                if (ghost.is_alive()) {
                    Direction ghost_direction = ghosts[i]->take_action(state, i);

                    if (ghost_direction == ghost.dir) {
                        ghost.step += ghost_speed(i);

                        if (ghost.step >= 1) {
                            --ghost.step;

                            Position next_pos = ghost.pos.move_destination(ghost_direction);
                            char cell_content = state.maze[next_pos.i][next_pos.j];

                            if (cell_content == State::WALL) {
                                _debug("Ghost #%d at [%d,%d] crashes with wall", i, ghost.pos.i, ghost.pos.j);
                            }
                            else {
                                ghost.pos.move(ghost_direction);

                                if (state.pacman.pos == next_pos and game_over_on_collision(ghost))
                                    goto end;
                            }
                        }
                    }
                    else {
                        ghost.step = (1 - ghost.step)*ghost_speed(i);
                        ghost.dir = ghost_direction;
                    }
                }
                else if (ghost.n_rounds_revive == 1) {
                    ghost.pos = ghost.initial_pos;
                    ghost.n_rounds_revive = 0;
                }
                else {
                    --ghost.n_rounds_revive;
                }

                state.ghosts[i].prev = ghost_previous_pos[i];
            }

            state.pacman.prev = pacman_previous_pos;

            if (Arguments::plays == 1) cout << state << endl;
        }

        end:

        if (Arguments::plays == 1) {
            cout << state << endl;
            cout << (game_over ? "LOST" : "WON") << endl;
        }

        this->result.won = not game_over;
        this->result.completion = 1 - (state.n_normal_pills_left + state.n_powerpills_left)/double(state.total_pills);
        pacman->notify_game_result(this->result.won);
        return this->result;
    }